

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

mfb_window * mfb_open_ex(char *title,uint width,uint height,uint flags)

{
  long lVar1;
  _Bool _Var2;
  long lVar3;
  undefined8 uVar4;
  mfb_timer *pmVar5;
  uint in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  undefined8 in_RDI;
  Atom sf_p;
  Atom sa_p;
  Atom sh_p;
  StyleHints sh;
  int windowHeight;
  int windowWidth;
  int posY;
  int posX;
  int screenHeight;
  int screenWidth;
  Window defaultRootWindow;
  SWindowData_X11 *window_data_x11;
  SWindowData *window_data;
  Visual *visual;
  XSizeHints sizeHints;
  XSetWindowAttributes windowAttributes;
  XPixmapFormatValues *formats;
  int convDepth;
  int formatCount;
  int i;
  int depth;
  undefined8 in_stack_fffffffffffffe38;
  uint uVar6;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe4c;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158 [5];
  uint32_t local_130;
  uint32_t local_12c;
  uint local_128;
  uint local_124;
  uint32_t local_120;
  uint32_t local_11c;
  undefined8 local_118;
  long *local_110;
  SWindowData *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  uint32_t local_e0;
  uint32_t local_dc;
  uint32_t local_d8;
  uint32_t local_d4;
  undefined1 local_a8 [8];
  undefined8 local_a0;
  undefined8 local_90;
  undefined4 local_80;
  long local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  uint32_t local_18;
  uint32_t local_14;
  undefined8 local_10;
  SWindowData *local_8;
  
  uVar6 = (uint)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_2c = -1;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_108 = (SWindowData *)malloc(0x2b0);
  if (local_108 == (SWindowData *)0x0) {
    local_8 = (SWindowData *)0x0;
  }
  else {
    memset(local_108,0,0x2b0);
    local_110 = (long *)malloc(0x38);
    if (local_110 == (long *)0x0) {
      free(local_108);
      local_8 = (SWindowData *)0x0;
    }
    else {
      memset(local_110,0,0x38);
      local_108->specific = local_110;
      lVar3 = XOpenDisplay(0);
      local_110[1] = lVar3;
      if (local_110[1] == 0) {
        free(local_108);
        free(local_110);
        local_8 = (SWindowData *)0x0;
      }
      else {
        init_keycodes((SWindowData_X11 *)
                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        *(undefined4 *)(local_110 + 2) = *(undefined4 *)(local_110[1] + 0xe0);
        local_100 = *(undefined8 *)
                     (*(long *)(local_110[1] + 0xe8) + (long)(int)local_110[2] * 0x80 + 0x40);
        local_38 = XListPixmapFormats(local_110[1],&local_28);
        local_20 = *(int *)(*(long *)(local_110[1] + 0xe8) + (long)(int)local_110[2] * 0x80 + 0x38);
        local_118 = *(undefined8 *)
                     (*(long *)(local_110[1] + 0xe8) + (long)*(int *)(local_110[1] + 0xe0) * 0x80 +
                     0x10);
        for (local_24 = 0; local_24 < local_28; local_24 = local_24 + 1) {
          if (local_20 == *(int *)(local_38 + (long)local_24 * 0xc)) {
            local_2c = *(int *)(local_38 + (long)local_24 * 0xc + 4);
            break;
          }
        }
        XFree(local_38);
        if (local_2c == 0x20) {
          local_11c = *(uint32_t *)
                       (*(long *)(local_110[1] + 0xe8) + (long)(int)local_110[2] * 0x80 + 0x18);
          local_120 = *(uint32_t *)
                       (*(long *)(local_110[1] + 0xe8) + (long)(int)local_110[2] * 0x80 + 0x1c);
          local_90 = *(undefined8 *)
                      (*(long *)(local_110[1] + 0xe8) + (long)(int)local_110[2] * 0x80 + 0x60);
          local_a0 = *(undefined8 *)
                      (*(long *)(local_110[1] + 0xe8) + (long)(int)local_110[2] * 0x80 + 0x60);
          local_80 = 0;
          local_108->window_width = local_14;
          local_108->window_height = local_18;
          local_108->buffer_width = local_14;
          local_108->buffer_height = local_18;
          local_108->buffer_stride = local_14 << 2;
          calc_dst_factor(local_108,local_14,local_18);
          if ((local_1c & 4) == 0) {
            local_124 = local_11c - local_14 >> 1;
            local_128 = local_120 - local_18 >> 1;
            local_12c = local_14;
            local_130 = local_18;
          }
          else {
            local_124 = 0;
            local_128 = 0;
            local_12c = local_11c;
            local_130 = local_120;
          }
          uVar7 = 1;
          lVar3 = XCreateWindow(local_110[1],local_118,local_124,local_128,local_12c,local_130,
                                (ulong)uVar6 << 0x20,local_20,1,local_100,0x4a,local_a8);
          *local_110 = lVar3;
          if (*local_110 == 0) {
            local_8 = (SWindowData *)0x0;
          }
          else {
            XSelectInput(local_110[1],*local_110,0x22807f);
            XStoreName(local_110[1],*local_110,local_10);
            if ((local_1c & 8) != 0) {
              memset(local_158,0,0x28);
              local_158[0] = 2;
              local_160 = XInternAtom(local_110[1],"_MOTIF_WM_HINTS",1);
              XChangeProperty(local_110[1],*local_110,local_160,local_160,0x20,0,local_158,5);
            }
            if ((local_1c & 0x10) != 0) {
              local_168 = XInternAtom(local_110[1],"_NET_WM_STATE_ABOVE",0);
              lVar3 = local_110[1];
              lVar1 = *local_110;
              uVar4 = XInternAtom(local_110[1],"_NET_WM_STATE",0);
              XChangeProperty(lVar3,lVar1,uVar4,4,0x20,0,&local_168,1);
            }
            if ((local_1c & 2) != 0) {
              local_170 = XInternAtom(local_110[1],"_NET_WM_STATE_FULLSCREEN",1);
              lVar3 = local_110[1];
              lVar1 = *local_110;
              uVar4 = XInternAtom(local_110[1],"_NET_WM_STATE",1);
              XChangeProperty(lVar3,lVar1,uVar4,4,0x20,0,&local_170,1);
            }
            local_f8 = 0x34;
            local_f0 = 0;
            local_ec = 0;
            local_e0 = local_14;
            local_dc = local_18;
            if ((local_1c & 1) == 0) {
              local_d8 = local_14;
              local_d4 = local_18;
            }
            else {
              local_d8 = local_11c;
              local_d4 = local_120;
            }
            s_delete_window_atom = XInternAtom(local_110[1],"WM_DELETE_WINDOW",0);
            XSetWMProtocols(local_110[1],*local_110,&s_delete_window_atom,1);
            _Var2 = create_GL_context((SWindowData *)CONCAT44(in_stack_fffffffffffffe4c,uVar7));
            if (_Var2) {
              XSetWMNormalHints(local_110[1],*local_110,&local_f8);
              XClearWindow(local_110[1],*local_110);
              XMapRaised(local_110[1],*local_110);
              XFlush(local_110[1]);
              local_110[3] = *(long *)(*(long *)(local_110[1] + 0xe8) +
                                       (long)(int)local_110[2] * 0x80 + 0x48);
              pmVar5 = mfb_timer_create();
              local_110[6] = (long)pmVar5;
              mfb_set_keyboard_callback((mfb_window *)local_108,keyboard_default);
              local_108->is_initialized = true;
              local_8 = local_108;
            }
            else {
              local_8 = (SWindowData *)0x0;
            }
          }
        }
        else {
          XCloseDisplay(local_110[1]);
          local_8 = (SWindowData *)0x0;
        }
      }
    }
  }
  return (mfb_window *)local_8;
}

Assistant:

struct mfb_window *
mfb_open_ex(const char *title, unsigned width, unsigned height, unsigned flags) {
    int depth, i, formatCount, convDepth = -1;
    XPixmapFormatValues* formats;
    XSetWindowAttributes windowAttributes;
    XSizeHints sizeHints;
    Visual* visual;

    SWindowData *window_data = (SWindowData *) malloc(sizeof(SWindowData));
    if (!window_data) {
        return 0x0;
    }
    memset(window_data, 0, sizeof(SWindowData));

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) malloc(sizeof(SWindowData_X11));
    if (!window_data_x11) {
        free(window_data);
        return 0x0;
    }
    memset(window_data_x11, 0, sizeof(SWindowData_X11));
    window_data->specific = window_data_x11;

    window_data_x11->display = XOpenDisplay(0);
    if (!window_data_x11->display) {
        free(window_data);
        free(window_data_x11);
        return 0x0;
    }

    init_keycodes(window_data_x11);

    window_data_x11->screen = DefaultScreen(window_data_x11->display);

    visual   = DefaultVisual(window_data_x11->display, window_data_x11->screen);
    formats  = XListPixmapFormats(window_data_x11->display, &formatCount);
    depth    = DefaultDepth(window_data_x11->display, window_data_x11->screen);

    Window defaultRootWindow = DefaultRootWindow(window_data_x11->display);

    for (i = 0; i < formatCount; ++i)
    {
        if (depth == formats[i].depth)
        {
            convDepth = formats[i].bits_per_pixel;
            break;
        }
    }

    XFree(formats);

    // We only support 32-bit right now
    if (convDepth != 32)
    {
        XCloseDisplay(window_data_x11->display);
        return 0x0;
    }

    int screenWidth  = DisplayWidth(window_data_x11->display, window_data_x11->screen);
    int screenHeight = DisplayHeight(window_data_x11->display, window_data_x11->screen);

    windowAttributes.border_pixel     = BlackPixel(window_data_x11->display, window_data_x11->screen);
    windowAttributes.background_pixel = BlackPixel(window_data_x11->display, window_data_x11->screen);
    windowAttributes.backing_store    = NotUseful;

    int posX, posY;
    int windowWidth, windowHeight;

    window_data->window_width  = width;
    window_data->window_height = height;
    window_data->buffer_width  = width;
    window_data->buffer_height = height;
    window_data->buffer_stride = width * 4;
    calc_dst_factor(window_data, width, height);

    if (flags & WF_FULLSCREEN_DESKTOP) {
        posX         = 0;
        posY         = 0;
        windowWidth  = screenWidth;
        windowHeight = screenHeight;
    }
    else {
        posX         = (screenWidth  - width)  / 2;
        posY         = (screenHeight - height) / 2;
        windowWidth  = width;
        windowHeight = height;
    }

    window_data_x11->window = XCreateWindow(
                    window_data_x11->display,
                    defaultRootWindow,
                    posX, posY,
                    windowWidth, windowHeight,
                    0,
                    depth,
                    InputOutput,
                    visual,
                    CWBackPixel | CWBorderPixel | CWBackingStore,
                    &windowAttributes);
    if (!window_data_x11->window)
        return 0x0;

    XSelectInput(window_data_x11->display, window_data_x11->window,
        KeyPressMask | KeyReleaseMask
        | ButtonPressMask | ButtonReleaseMask | PointerMotionMask
        | StructureNotifyMask | ExposureMask
        | FocusChangeMask
        | EnterWindowMask | LeaveWindowMask
    );

    XStoreName(window_data_x11->display, window_data_x11->window, title);

    if (flags & WF_BORDERLESS) {
        struct StyleHints {
            unsigned long   flags;
            unsigned long   functions;
            unsigned long   decorations;
            long            inputMode;
            unsigned long   status;
        } sh = {
            .flags       = 2,
            .functions   = 0,
            .decorations = 0,
            .inputMode   = 0,
            .status      = 0,
        };
        Atom sh_p = XInternAtom(window_data_x11->display, "_MOTIF_WM_HINTS", True);
        XChangeProperty(window_data_x11->display, window_data_x11->window, sh_p, sh_p, 32, PropModeReplace, (unsigned char*)&sh, 5);
    }

    if (flags & WF_ALWAYS_ON_TOP) {
        Atom sa_p = XInternAtom(window_data_x11->display, "_NET_WM_STATE_ABOVE", False);
        XChangeProperty(window_data_x11->display, window_data_x11->window, XInternAtom(window_data_x11->display, "_NET_WM_STATE", False), XA_ATOM, 32, PropModeReplace, (unsigned char *)&sa_p, 1);
    }

    if (flags & WF_FULLSCREEN) {
        Atom sf_p = XInternAtom(window_data_x11->display, "_NET_WM_STATE_FULLSCREEN", True);
        XChangeProperty(window_data_x11->display, window_data_x11->window, XInternAtom(window_data_x11->display, "_NET_WM_STATE", True), XA_ATOM, 32, PropModeReplace, (unsigned char*)&sf_p, 1);
    }

    sizeHints.flags      = PPosition | PMinSize | PMaxSize;
    sizeHints.x          = 0;
    sizeHints.y          = 0;
    sizeHints.min_width  = width;
    sizeHints.min_height = height;
    if (flags & WF_RESIZABLE) {
        sizeHints.max_width  = screenWidth;
        sizeHints.max_height = screenHeight;
    }
    else {
        sizeHints.max_width  = width;
        sizeHints.max_height = height;
    }

    s_delete_window_atom = XInternAtom(window_data_x11->display, "WM_DELETE_WINDOW", False);
    XSetWMProtocols(window_data_x11->display, window_data_x11->window, &s_delete_window_atom, 1);

#if defined(USE_OPENGL_API)
    if(create_GL_context(window_data) == false) {
        return 0x0;
    }

#else
    window_data_x11->image = XCreateImage(window_data_x11->display, CopyFromParent, depth, ZPixmap, 0, 0x0, width, height, 32, width * 4);
#endif

    XSetWMNormalHints(window_data_x11->display, window_data_x11->window, &sizeHints);
    XClearWindow(window_data_x11->display, window_data_x11->window);
    XMapRaised(window_data_x11->display, window_data_x11->window);
    XFlush(window_data_x11->display);

    window_data_x11->gc = DefaultGC(window_data_x11->display, window_data_x11->screen);

    window_data_x11->timer = mfb_timer_create();

    mfb_set_keyboard_callback((struct mfb_window *) window_data, keyboard_default);

#if defined(_DEBUG) || defined(DEBUG)
    printf("Window created using X11 API\n");
#endif

    window_data->is_initialized = true;
    return (struct mfb_window *) window_data;
}